

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::callSolveQp(Highs *this)

{
  int iVar1;
  bool bVar2;
  QpAsmStatus QVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pdVar7;
  HighsOptions *in_RDI;
  double dVar8;
  HighsStatus return_status;
  QpAsmStatus status;
  HighsInt qp_update_limit;
  Statistics stats;
  Settings settings;
  double *i_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<double,_std::allocator<double>_> *__range2_1;
  double *i_1;
  iterator __end2;
  iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  HighsInt i;
  Instance instance;
  HighsHessian *hessian;
  HighsLp *lp;
  function<void_(Statistics_&)> *in_stack_fffffffffffffab8;
  Instance *in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  HighsModel *in_stack_fffffffffffffad0;
  allocator *paVar9;
  undefined8 in_stack_fffffffffffffae8;
  Instance *in_stack_fffffffffffffaf0;
  allocator local_4d1;
  string local_4d0 [36];
  HighsStatus local_4ac;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb60;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb78;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb80;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb88;
  HighsInfo *in_stack_fffffffffffffb90;
  HighsBasis *in_stack_fffffffffffffb98;
  HighsSolution *in_stack_fffffffffffffba0;
  HighsModel *in_stack_fffffffffffffba8;
  HighsOptions *options;
  int local_420;
  int local_41c;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffcd4;
  HighsBasis *in_stack_fffffffffffffcd8;
  HighsModelStatus *in_stack_fffffffffffffce0;
  Statistics *in_stack_fffffffffffffce8;
  Settings *settings_00;
  Instance *in_stack_fffffffffffffcf8;
  HighsTimer *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd20;
  Highs *in_stack_fffffffffffffd28;
  uint local_294;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_260;
  undefined1 *local_258;
  reference local_250;
  double *local_248;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_240;
  vector<double,_std::allocator<double>_> *local_238;
  int local_230;
  HighsInt local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined8 local_210;
  int local_208;
  vector<int,_std::allocator<int>_> vStack_200;
  vector<double,_std::allocator<double>_> local_1e8 [4];
  undefined4 local_178;
  undefined4 local_174;
  undefined1 local_140 [160];
  undefined4 local_a0;
  undefined4 local_9c;
  HighsInt *local_20;
  double *local_18;
  HighsStatus local_4;
  
  local_18 = &(in_RDI->super_HighsOptionsStruct).dual_residual_tolerance;
  local_20 = &in_RDI[1].super_HighsOptionsStruct.random_seed;
  if (*(int *)local_18 < *local_20) {
    highsLogDev((HighsLogOptions *)&in_RDI[3].super_HighsOptionsStruct.simplex_dualize_strategy,
                kError,"Hessian dimension = %d is incompatible with matrix dimension = %d\n",
                (ulong)(uint)*local_20,(ulong)*(uint *)local_18);
    in_RDI[4].super_HighsOptionsStruct.restart_presolve_reduction_limit = 2;
    (in_RDI->super_HighsOptionsStruct).presolve._M_dataplus = (_Alloc_hider)0x0;
    (in_RDI->super_HighsOptionsStruct).presolve.field_0x1 = 0;
    local_4 = kError;
  }
  else {
    Instance::Instance(in_stack_fffffffffffffaf0,
                       (HighsInt)((ulong)in_stack_fffffffffffffae8 >> 0x20),
                       (HighsInt)in_stack_fffffffffffffae8);
    local_220 = *(HighsInt *)(local_18 + 0x1e);
    local_218 = *(undefined4 *)((long)local_18 + 4);
    local_21c = *(undefined4 *)local_18;
    local_9c = *(undefined4 *)local_18;
    local_a0 = *(undefined4 *)((long)local_18 + 4);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb60,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb60,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffb60,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffb60,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    local_210 = local_18[0x1f];
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffb60,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffb60,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffb60,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffb60,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    local_174 = *(undefined4 *)local_18;
    local_178 = *(undefined4 *)local_18;
    triangularToSquareHessian
              ((HighsHessian *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
               in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    for (local_230 = 0; iVar1 = local_230,
        sVar4 = std::vector<double,_std::allocator<double>_>::size(local_1e8), iVar1 < (int)sVar4;
        local_230 = local_230 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_1e8,(long)local_230);
      iVar1 = local_230;
      if ((*pvVar5 != 0.0) || (NAN(*pvVar5))) {
        sVar4 = (size_type)local_208;
        local_208 = local_208 + 1;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_200,sVar4);
        *pvVar6 = iVar1;
      }
    }
    if (*(int *)(local_18 + 0x1e) == -1) {
      local_238 = local_1e8;
      local_240._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab8);
      local_248 = (double *)
                  std::vector<double,_std::allocator<double>_>::end
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffac0,
                                (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffab8), bVar2) {
        local_250 = __gnu_cxx::
                    __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                    operator*(&local_240);
        *local_250 = *local_250 * -1.0;
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&local_240);
      }
      local_258 = local_140;
      local_260._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab8);
      std::vector<double,_std::allocator<double>_>::end
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffab8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffac0,
                                (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_stack_fffffffffffffab8), bVar2) {
        pdVar7 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_260);
        *pdVar7 = *pdVar7 * -1.0;
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&local_260);
      }
    }
    Settings::Settings((Settings *)in_stack_fffffffffffffac0);
    Statistics::Statistics((Statistics *)in_stack_fffffffffffffac0);
    if (local_294 != 1000) {
      highsLogUser((HighsLogOptions *)&in_RDI[3].super_HighsOptionsStruct.simplex_dualize_strategy,
                   kInfo,"Changing QP reinversion frequency from %d to %d\n",(ulong)local_294,1000);
    }
    options = in_RDI;
    std::function<void(QpModelStatus&)>::function<Highs::callSolveQp()::__0,void>
              ((function<void_(QpModelStatus_&)> *)in_stack_fffffffffffffad0,
               (anon_class_8_1_8991fb9c *)
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    Eventhandler<QpModelStatus_&>::subscribe
              ((Eventhandler<QpModelStatus_&> *)in_stack_fffffffffffffac0,
               (function<void_(QpModelStatus_&)> *)in_stack_fffffffffffffab8);
    std::function<void_(QpModelStatus_&)>::~function((function<void_(QpModelStatus_&)> *)0x48db3f);
    std::function<void(Statistics&)>::function<Highs::callSolveQp()::__1,void>
              ((function<void_(Statistics_&)> *)in_stack_fffffffffffffad0,
               (anon_class_8_1_8991fb9c *)
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    Eventhandler<Statistics_&>::subscribe
              ((Eventhandler<Statistics_&> *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    std::function<void_(Statistics_&)>::~function((function<void_(Statistics_&)> *)0x48db91);
    std::function<void(int&)>::function<Highs::callSolveQp()::__2,void>
              ((function<void_(int_&)> *)in_stack_fffffffffffffad0,
               (anon_class_8_1_8991fb9c *)
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    Eventhandler<int_&>::subscribe
              ((Eventhandler<int_&> *)in_stack_fffffffffffffac0,
               (function<void_(int_&)> *)in_stack_fffffffffffffab8);
    std::function<void_(int_&)>::~function((function<void_(int_&)> *)0x48dbe3);
    settings_00 = (Settings *)
                  in_RDI[2].super_HighsOptionsStruct.log_options.user_callback._M_invoker;
    iVar1 = *(int *)((long)&in_RDI[3].super_HighsOptionsStruct.presolve.field_2 + 4);
    if (iVar1 == 0) {
      uVar10 = 1;
    }
    else if (iVar1 == 1) {
      uVar10 = 2;
    }
    else if (iVar1 == 2) {
      uVar10 = 0;
    }
    else {
      uVar10 = 2;
    }
    highsLogUser((HighsLogOptions *)&in_RDI[3].super_HighsOptionsStruct.simplex_dualize_strategy,
                 kInfo,"  Iteration        Objective     NullspaceDim\n");
    QVar3 = solveqp(in_stack_fffffffffffffcf8,settings_00,in_stack_fffffffffffffce8,
                    in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                    (HighsSolution *)CONCAT44(in_stack_fffffffffffffcd4,uVar10),
                    in_stack_fffffffffffffd10);
    if (QVar3 == kError) {
      local_4 = kError;
    }
    else {
      local_4ac = (HighsStatus)(QVar3 == kWarning);
      dVar8 = HighsModel::objectiveValue
                        (in_stack_fffffffffffffad0,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
      *(double *)((long)&in_RDI[3].super_HighsOptionsStruct.icrash_strategy.field_2 + 8) = dVar8;
      getKktFailures(options,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                     in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      *(int *)&in_RDI[3].super_HighsOptionsStruct.icrash =
           local_420 + *(int *)&in_RDI[3].super_HighsOptionsStruct.icrash;
      *(int *)&in_RDI[3].super_HighsOptionsStruct.icrash_strategy._M_string_length =
           local_41c + (int)in_RDI[3].super_HighsOptionsStruct.icrash_strategy._M_string_length;
      in_RDI[3].super_HighsOptionsStruct.less_infeasible_DSE_check = true;
      if (in_RDI[4].super_HighsOptionsStruct.restart_presolve_reduction_limit == 7) {
        paVar9 = &local_4d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4d0,"QP",paVar9);
        local_4 = checkOptimality(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
        std::__cxx11::string::~string(local_4d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
      }
      else {
        local_4 = local_4ac;
      }
    }
    Statistics::~Statistics((Statistics *)in_stack_fffffffffffffac0);
    Settings::~Settings((Settings *)in_stack_fffffffffffffac0);
    Instance::~Instance(in_stack_fffffffffffffac0);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::callSolveQp() {
  // Check that the model is column-wise
  HighsLp& lp = model_.lp_;
  HighsHessian& hessian = model_.hessian_;
  assert(model_.lp_.a_matrix_.isColwise());
  if (hessian.dim_ > lp.num_col_) {
    highsLogDev(
        options_.log_options, HighsLogType::kError,
        "Hessian dimension = %d is incompatible with matrix dimension = %d\n",
        int(hessian.dim_), int(lp.num_col_));
    model_status_ = HighsModelStatus::kModelError;
    solution_.value_valid = false;
    solution_.dual_valid = false;
    return HighsStatus::kError;
  }
  //
  // Run the QP solver
  Instance instance(lp.num_col_, lp.num_row_);

  instance.sense = HighsInt(lp.sense_);
  instance.num_con = lp.num_row_;
  instance.num_var = lp.num_col_;

  instance.A.mat.num_col = lp.num_col_;
  instance.A.mat.num_row = lp.num_row_;
  instance.A.mat.start = lp.a_matrix_.start_;
  instance.A.mat.index = lp.a_matrix_.index_;
  instance.A.mat.value = lp.a_matrix_.value_;
  instance.c.value = lp.col_cost_;
  instance.offset = lp.offset_;
  instance.con_lo = lp.row_lower_;
  instance.con_up = lp.row_upper_;
  instance.var_lo = lp.col_lower_;
  instance.var_up = lp.col_upper_;
  instance.Q.mat.num_col = lp.num_col_;
  instance.Q.mat.num_row = lp.num_col_;
  triangularToSquareHessian(hessian, instance.Q.mat.start, instance.Q.mat.index,
                            instance.Q.mat.value);

  for (HighsInt i = 0; i < (HighsInt)instance.c.value.size(); i++) {
    if (instance.c.value[i] != 0.0) {
      instance.c.index[instance.c.num_nz++] = i;
    }
  }

  if (lp.sense_ == ObjSense::kMaximize) {
    // Negate the vector and Hessian
    for (double& i : instance.c.value) {
      i *= -1.0;
    }
    for (double& i : instance.Q.mat.value) {
      i *= -1.0;
    }
  }

  Settings settings;
  Statistics stats;

  settings.reportingfequency = 100;

  // Setting qp_update_limit = 10 leads to error with lpHighs3
  const HighsInt qp_update_limit = 1000;  // 1000; // default
  if (qp_update_limit != settings.reinvertfrequency) {
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Changing QP reinversion frequency from %d to %d\n",
                 int(settings.reinvertfrequency), int(qp_update_limit));
    settings.reinvertfrequency = qp_update_limit;
  }

  settings.iteration_limit = options_.qp_iteration_limit;
  settings.nullspace_limit = options_.qp_nullspace_limit;

  // Define the QP model status logging function
  settings.qp_model_status_log.subscribe(
      [this](QpModelStatus& qp_model_status) {
        if (qp_model_status == QpModelStatus::kUndetermined ||
            qp_model_status == QpModelStatus::kLargeNullspace ||
            qp_model_status == QpModelStatus::kError ||
            qp_model_status == QpModelStatus::kNotset)
          highsLogUser(options_.log_options, HighsLogType::kInfo,
                       "QP solver model status: %s\n",
                       qpModelStatusToString(qp_model_status).c_str());
      });

  // Define the QP solver iteration logging function
  settings.iteration_log.subscribe([this](Statistics& stats) {
    int rep = stats.iteration.size() - 1;
    std::string time_string =
        options_.timeless_log ? ""
                              : highsFormatToString(" %9.2fs", stats.time[rep]);
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "%11d  %15.8g           %6d%s\n", int(stats.iteration[rep]),
                 stats.objval[rep], int(stats.nullspacedimension[rep]),
                 time_string.c_str());
  });

  // Define the QP nullspace limit logging function
  settings.nullspace_limit_log.subscribe([this](HighsInt& nullspace_limit) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "QP solver has exceeded nullspace limit of %d\n",
                 int(nullspace_limit));
  });

  settings.time_limit = options_.time_limit;
  settings.lambda_zero_threshold = options_.dual_feasibility_tolerance;

  switch (options_.simplex_primal_edge_weight_strategy) {
    case 0:
      settings.pricing = PricingStrategy::DantzigWolfe;
      break;
    case 1:
      settings.pricing = PricingStrategy::Devex;
      break;
    case 2:
      settings.pricing = PricingStrategy::SteepestEdge;
      break;
    default:
      settings.pricing = PricingStrategy::Devex;
  }

  // print header for QP solver output
  highsLogUser(options_.log_options, HighsLogType::kInfo,
               "  Iteration        Objective     NullspaceDim\n");

  QpAsmStatus status = solveqp(instance, settings, stats, model_status_, basis_,
                               solution_, timer_);
  // QP solver can fail, so should return something other than QpAsmStatus::kOk
  if (status == QpAsmStatus::kError) return HighsStatus::kError;

  assert(status == QpAsmStatus::kOk || status == QpAsmStatus::kWarning);
  HighsStatus return_status = status == QpAsmStatus::kWarning
                                  ? HighsStatus::kWarning
                                  : HighsStatus::kOk;

  // Get the objective and any KKT failures
  info_.objective_function_value = model_.objectiveValue(solution_.col_value);
  getKktFailures(options_, model_, solution_, basis_, info_);
  // Set the QP-specific values of info_
  info_.simplex_iteration_count += stats.phase1_iterations;
  info_.qp_iteration_count += stats.num_iterations;
  info_.valid = true;
  if (model_status_ == HighsModelStatus::kOptimal) return checkOptimality("QP");
  return return_status;
}